

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reverse.cpp
# Opt level: O1

void reverse(void)

{
  uint8_t *puVar1;
  void *pvVar2;
  undefined8 uVar3;
  uint16_t uVar4;
  pointer paVar5;
  int iVar6;
  Rgba RVar7;
  uint uVar8;
  int iVar9;
  undefined8 uVar10;
  ulong uVar11;
  undefined4 extraout_var;
  __visit_result_t<Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:62:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:63:29)>,_std::variant<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>_&>
  pbVar12;
  long lVar13;
  undefined4 extraout_var_00;
  ulong uVar14;
  int *piVar15;
  char *pcVar16;
  byte bVar17;
  ulong uVar18;
  ulong uVar19;
  byte bVar20;
  char cVar21;
  iterator __begin2;
  long lVar22;
  long lVar23;
  ulong uVar24;
  ulong uVar25;
  array<unsigned_char,_16UL> *paVar26;
  uint8_t y;
  long lVar27;
  byte bVar28;
  Rgba *__first2;
  uchar *attr;
  Rgba *__last1;
  ulong uVar29;
  bool bVar30;
  initializer_list<std::array<Rgba,_4UL>_> __l;
  png_structp png;
  vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_> palettes;
  png_infop pngInfo;
  ulong local_2d8;
  optional<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  attrmap;
  optional<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  tilemap;
  uint8_t *rowPtrs [8];
  optional<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  palmap;
  vector<unsigned_char,_std::allocator<unsigned_char>_> tileRow;
  DefaultInitVec<uint8_t> tiles;
  Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:77:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:83:29)>
  local_1d8;
  png_color_8 sbitChunk;
  path local_1c8;
  path local_1a0;
  path local_178;
  File pngFile;
  path local_58;
  
  uVar10 = png_get_libpng_ver(0);
  Options::verbosePrint(&options,'\x01',"Using libpng %s\n",uVar10);
  if (options.output.super__Optional_base<std::filesystem::__cxx11::path,_false,_false>._M_payload.
      super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>.
      super__Optional_payload_base<std::filesystem::__cxx11::path>._M_engaged == false) {
    fatal("Tile data must be provided when reversing an image!");
  }
  if ((options.allowDedup == true) &&
     (options.tilemap.super__Optional_base<std::filesystem::__cxx11::path,_false,_false>._M_payload.
      super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>.
      super__Optional_payload_base<std::filesystem::__cxx11::path>._M_engaged == false)) {
    warning("Tile deduplication is enabled, but no tilemap is provided?");
  }
  if (options.useColorCurve == true) {
    warning("The color curve is not yet supported in reverse mode...");
  }
  if (((options.inputSlice.left != 0) || (options.inputSlice.top != 0)) ||
     (options.inputSlice.height != 0)) {
    warning("\"Sliced-off\" pixels are ignored in reverse mode");
  }
  if ((options.inputSlice.width != 0) &&
     ((uint)options.reversedWidth * 8 != (uint)options.inputSlice.width)) {
    warning("Specified input slice width (%u) doesn\'t match provided reversing width (%u * 8)");
  }
  Options::verbosePrint(&options,'\x02',"Reading tiles...\n");
  std::filesystem::__cxx11::path::path(&local_58,(path *)&options.output);
  readInto(&tiles,&local_58);
  std::filesystem::__cxx11::path::~path(&local_58);
  uVar24 = (long)tiles.
                 super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)tiles.
                 super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  uVar18 = (ulong)(byte)(options.bitDepth << 3);
  if (uVar24 % uVar18 != 0) {
    fatal("Tile data size (%zu bytes) is not a multiple of %u bytes",uVar24,uVar18);
  }
  uVar24 = uVar24 / uVar18 + options.trim;
  Options::verbosePrint(&options,'\x03',"Read %zu tiles.\n",uVar24);
  tilemap.
  super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_engaged = false;
  if (options.tilemap.super__Optional_base<std::filesystem::__cxx11::path,_false,_false>._M_payload.
      super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>.
      super__Optional_payload_base<std::filesystem::__cxx11::path>._M_engaged == true) {
    std::filesystem::__cxx11::path::path(&local_178,(path *)&options.tilemap);
    readInto((DefaultInitVec<uint8_t> *)&pngFile,&local_178);
    std::
    optional<std::vector<unsigned_char,default_init_allocator<unsigned_char,std::allocator<unsigned_char>>>>
    ::operator=((optional<std::vector<unsigned_char,default_init_allocator<unsigned_char,std::allocator<unsigned_char>>>>
                 *)&tilemap,
                (vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)&pngFile);
    pvVar2 = (void *)CONCAT44(pngFile._file.
                              super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                              .
                              super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                              .
                              super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                              .
                              super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                              .
                              super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                              .
                              super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                              ._M_u._4_4_,
                              pngFile._file.
                              super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                              .
                              super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                              .
                              super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                              .
                              super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                              .
                              super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                              .
                              super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                              ._M_u._0_4_);
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2,pngFile._file.
                             super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                             .
                             super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                             .
                             super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                             .
                             super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                             .
                             super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                             .
                             super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                             ._M_u._16_8_ - (long)pvVar2);
    }
    std::filesystem::__cxx11::path::~path(&local_178);
    uVar24 = (long)tilemap.
                   super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
                   ._M_payload.
                   super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
                   .
                   super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ._M_payload._M_value.
                   super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             tilemap.
             super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
             ._M_payload.
             super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ._M_payload._0_8_;
    Options::verbosePrint(&options,'\x03',"Read %zu tilemap entries.\n",uVar24);
  }
  if (uVar24 == 0) {
    fatal("Cannot generate empty image");
  }
  if ((ulong)options.maxNbTiles._M_elems[1] + (ulong)options.maxNbTiles._M_elems[0] < uVar24) {
    warning("Read %zu tiles, more than the limit of %zu + %zu",uVar24);
  }
  uVar29 = (ulong)options.reversedWidth;
  uVar11 = uVar24 / uVar29;
  if (uVar24 % uVar29 != 0) {
    fatal("Total number of tiles read (%zu) cannot be divided by image width (%zu tiles)",uVar24,
          uVar29);
  }
  Options::verbosePrint(&options,'\x03',"Reversed image dimensions: %zux%zu tiles\n",uVar29,uVar11);
  pngFile._file.
  super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
  .super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>._M_u._0_4_ =
       0xffffffff;
  pngFile._file.
  super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
  .super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>._M_u._4_4_ =
       0xffaaaaaa;
  pngFile._file.
  super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
  .super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>._M_u._8_4_ =
       0xff555555;
  pngFile._file.
  super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
  .super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>._M_u._12_4_
       = 0xff000000;
  __l._M_len = 1;
  __l._M_array = (iterator)&pngFile;
  std::vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>::vector
            (&palettes,__l,(allocator_type *)rowPtrs);
  local_2d8 = uVar11;
  if (options.palettes.super__Optional_base<std::filesystem::__cxx11::path,_false,_false>._M_payload
      .super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>.
      super__Optional_payload_base<std::filesystem::__cxx11::path>._M_engaged != true) {
    if (options.palSpecType == EXPLICIT) {
      std::vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>::_M_move_assign
                (&palettes,0x11f370);
    }
    else if (options.palSpecType == EMBEDDED) {
      warning(
             "An embedded palette was requested, but no palette file was specified; ignoring request."
             );
    }
    goto LAB_001126c0;
  }
  pngFile._file.
  super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
  .super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>._M_u._0_4_ =
       0;
  pngFile._file.
  super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
  .super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>._M_u._4_4_ =
       0;
  pngFile._file.
  super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
  .super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>._M_index =
       '\0';
  iVar6 = File::open(&pngFile,(char *)&options.palettes,0xc);
  if (CONCAT44(extraout_var,iVar6) == 0) {
    attrmap.
    super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ._M_payload._M_value.
    super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)&options.palettes;
    std::
    visit_abi_cxx11_<Visitor<File::string(std::filesystem::__cxx11::path_const&)const::_lambda(std::filebuf_const&)_1_,File::string[abi:cxx11](std::filesystem::__cxx11::path_const&)const::_lambda(std::streambuf_const*)_1_>,std::variant<std::streambuf*,std::filebuf>const&>
              ((__visit_result_t<Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:90:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:91:29)>,_const_std::variant<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>_&>
                *)rowPtrs,
               (Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:90:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:91:29)>
                *)&attrmap,&pngFile._file);
    piVar15 = __errno_location();
    pcVar16 = strerror(*piVar15);
    fatal("Failed to open \"%s\": %s",rowPtrs[0],pcVar16);
  }
  if (palettes.super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      palettes.super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    palettes.super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         palettes.super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  }
  while( true ) {
    pbVar12 = std::operator*((Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:62:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:63:29)>
                              *)&attrmap,&pngFile._file);
    lVar13 = (**(code **)(*(long *)pbVar12 + 0x40))(pbVar12,rowPtrs,8);
    uVar11 = local_2d8;
    if (lVar13 != 8) break;
    if (palettes.super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        palettes.super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>::
      _M_realloc_insert<>(&palettes,
                          (iterator)
                          palettes.
                          super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish);
    }
    else {
      (palettes.super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
       _M_impl.super__Vector_impl_data._M_finish)->_M_elems[0].red = '\0';
      (palettes.super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
       _M_impl.super__Vector_impl_data._M_finish)->_M_elems[0].green = '\0';
      (palettes.super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
       _M_impl.super__Vector_impl_data._M_finish)->_M_elems[0].blue = '\0';
      (palettes.super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
       _M_impl.super__Vector_impl_data._M_finish)->_M_elems[0].alpha = '\0';
      (palettes.super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
       _M_impl.super__Vector_impl_data._M_finish)->_M_elems[1].red = '\0';
      (palettes.super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
       _M_impl.super__Vector_impl_data._M_finish)->_M_elems[1].green = '\0';
      (palettes.super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
       _M_impl.super__Vector_impl_data._M_finish)->_M_elems[1].blue = '\0';
      (palettes.super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
       _M_impl.super__Vector_impl_data._M_finish)->_M_elems[1].alpha = '\0';
      (palettes.super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
       _M_impl.super__Vector_impl_data._M_finish)->_M_elems[2].red = '\0';
      (palettes.super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
       _M_impl.super__Vector_impl_data._M_finish)->_M_elems[2].green = '\0';
      (palettes.super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
       _M_impl.super__Vector_impl_data._M_finish)->_M_elems[2].blue = '\0';
      (palettes.super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
       _M_impl.super__Vector_impl_data._M_finish)->_M_elems[2].alpha = '\0';
      (palettes.super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
       _M_impl.super__Vector_impl_data._M_finish)->_M_elems[3].red = '\0';
      (palettes.super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
       _M_impl.super__Vector_impl_data._M_finish)->_M_elems[3].green = '\0';
      (palettes.super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
       _M_impl.super__Vector_impl_data._M_finish)->_M_elems[3].blue = '\0';
      (palettes.super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
       _M_impl.super__Vector_impl_data._M_finish)->_M_elems[3].alpha = '\0';
      palettes.super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           palettes.
           super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    paVar5 = palettes.
             super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (options.nbColorsPerPal != '\0') {
      uVar11 = (ulong)options.nbColorsPerPal;
      lVar22 = 0;
      lVar13 = (long)rowPtrs + 1;
      do {
        RVar7 = Rgba::fromCGBColor(*(uint16_t *)(lVar13 + -1));
        *(Rgba *)(&paVar5[-1]._M_elems[0].red + lVar22) = RVar7;
        lVar13 = lVar13 + 2;
        lVar22 = lVar22 + 4;
      } while (uVar11 * 4 != lVar22);
    }
  }
  if (lVar13 != 0) {
    fatal("Palette data size (%zu) is not a multiple of %zu bytes!\n",
          ((long)palettes.
                 super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)palettes.
                 super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 1) + lVar13,8);
  }
  if ((ulong)options.nbPalettes <
      (ulong)((long)palettes.
                    super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)palettes.
                    super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4)) {
    warning("Read %zu palettes, more than the specified limit of %zu");
  }
  paVar5 = palettes.
           super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  __first2 = (options.palSpec.
              super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
              _M_impl.super__Vector_impl_data._M_start)->_M_elems;
  if (options.palSpecType == EXPLICIT) {
    if ((long)palettes.
              super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)palettes.
              super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
              _M_impl.super__Vector_impl_data._M_start ==
        (long)options.palSpec.
              super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)options.palSpec.
              super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
              _M_impl.super__Vector_impl_data._M_start) {
      bVar30 = palettes.
               super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
               _M_impl.super__Vector_impl_data._M_start ==
               palettes.
               super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (bVar30) {
LAB_001126a1:
        if (bVar30) goto LAB_001126b3;
      }
      else {
        __last1 = palettes.
                  super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[1]._M_elems;
        bVar30 = std::__equal<false>::equal<Rgba_const*,Rgba_const*>
                           ((palettes.
                             super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_elems,__last1,
                            (options.palSpec.
                             super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_elems);
        if (bVar30) {
          do {
            __first2 = __first2 + 4;
            bVar30 = __last1 == paVar5->_M_elems;
            if (bVar30) goto LAB_001126a1;
            bVar30 = std::__equal<false>::equal<Rgba_const*,Rgba_const*>
                               (__last1,__last1 + 4,__first2);
            uVar11 = local_2d8;
            __last1 = __last1 + 4;
          } while (bVar30);
        }
      }
    }
    warning("Colors in the palette file do not match those specified with `-c`!");
  }
LAB_001126b3:
  File::~File(&pngFile);
LAB_001126c0:
  iVar6 = (int)uVar11;
  attrmap.
  super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_engaged = false;
  if (options.attrmap.super__Optional_base<std::filesystem::__cxx11::path,_false,_false>._M_payload.
      super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>.
      super__Optional_payload_base<std::filesystem::__cxx11::path>._M_engaged == true) {
    std::filesystem::__cxx11::path::path(&local_1a0,(path *)&options.attrmap);
    readInto((DefaultInitVec<uint8_t> *)&pngFile,&local_1a0);
    std::
    optional<std::vector<unsigned_char,default_init_allocator<unsigned_char,std::allocator<unsigned_char>>>>
    ::operator=((optional<std::vector<unsigned_char,default_init_allocator<unsigned_char,std::allocator<unsigned_char>>>>
                 *)&attrmap,
                (vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)&pngFile);
    pvVar2 = (void *)CONCAT44(pngFile._file.
                              super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                              .
                              super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                              .
                              super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                              .
                              super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                              .
                              super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                              .
                              super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                              ._M_u._4_4_,
                              pngFile._file.
                              super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                              .
                              super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                              .
                              super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                              .
                              super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                              .
                              super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                              .
                              super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                              ._M_u._0_4_);
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2,pngFile._file.
                             super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                             .
                             super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                             .
                             super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                             .
                             super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                             .
                             super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                             .
                             super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                             ._M_u._16_8_ - (long)pvVar2);
    }
    std::filesystem::__cxx11::path::~path(&local_1a0);
    if ((long)attrmap.
              super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ._M_payload._M_value.
              super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        attrmap.
        super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_payload._0_8_ != uVar24) {
      fatal("Attribute map size (%zu tiles) doesn\'t match image\'s (%zu)",
            (long)attrmap.
                  super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ._M_payload._M_value.
                  super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            attrmap.
            super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ._M_payload._0_8_,uVar24);
    }
    if (attrmap.
        super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_payload._M_value.
        super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        attrmap.
        super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_payload._M_value.
        super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      bVar30 = false;
      uVar10 = attrmap.
               super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
               ._M_payload.
               super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ._M_payload._M_value.
               super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        bVar20 = *(byte *)uVar10;
        if ((ulong)((long)palettes.
                          super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)palettes.
                          super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 4) < (ulong)(bVar20 & 7)) {
          bVar30 = true;
          error("Referencing palette %u, but there are only %zu!");
        }
        if (((bVar20 & 8) != 0) &&
           (tilemap.
            super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ._M_engaged == false)) {
          warning("Tile in bank 1 but no tilemap specified; ignoring the bank bit");
        }
        uVar10 = uVar10 + 1;
      } while ((pointer)uVar10 !=
               attrmap.
               super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
               ._M_payload.
               super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ._M_payload._M_value.
               super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
      iVar6 = (int)local_2d8;
      if (bVar30) {
        giveUp();
      }
    }
  }
  if (tilemap.
      super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ._M_engaged == true) {
    uVar10 = tilemap.
             super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
             ._M_payload.
             super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ._M_payload._M_value.
             super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar3 = attrmap.
            super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ._M_payload._M_value.
            super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
    if (attrmap.
        super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_engaged == true) {
      for (; (pointer)uVar10 !=
             tilemap.
             super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
             ._M_payload.
             super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ._M_payload._M_value.
             super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
             ._M_impl.super__Vector_impl_data._M_finish; uVar10 = (byte *)(uVar10 + 1)) {
        uVar8 = *(byte *)uVar3 >> 3 & 1;
        if (options.maxNbTiles._M_elems[uVar8] <= (ushort)*(byte *)uVar10) {
          warning("Tile #%u was referenced, but the limit for bank %u is %u",(ulong)*(byte *)uVar10,
                  (ulong)(byte)uVar8);
        }
        uVar3 = (byte *)(uVar3 + 1);
      }
    }
    else {
      for (; (pointer)uVar10 !=
             tilemap.
             super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
             ._M_payload.
             super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ._M_payload._M_value.
             super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
             ._M_impl.super__Vector_impl_data._M_finish; uVar10 = (byte *)(uVar10 + 1)) {
        if (options.maxNbTiles._M_elems[0] <= *(byte *)uVar10) {
          warning("Tile #%u was referenced, but the limit is %u",(ulong)*(byte *)uVar10);
        }
      }
    }
  }
  palmap.
  super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_engaged = false;
  if (options.palmap.super__Optional_base<std::filesystem::__cxx11::path,_false,_false>._M_payload.
      super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>.
      super__Optional_payload_base<std::filesystem::__cxx11::path>._M_engaged == true) {
    std::filesystem::__cxx11::path::path(&local_1c8,(path *)&options.palmap);
    readInto((DefaultInitVec<uint8_t> *)&pngFile,&local_1c8);
    std::
    optional<std::vector<unsigned_char,default_init_allocator<unsigned_char,std::allocator<unsigned_char>>>>
    ::operator=((optional<std::vector<unsigned_char,default_init_allocator<unsigned_char,std::allocator<unsigned_char>>>>
                 *)&palmap,
                (vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)&pngFile);
    pvVar2 = (void *)CONCAT44(pngFile._file.
                              super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                              .
                              super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                              .
                              super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                              .
                              super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                              .
                              super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                              .
                              super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                              ._M_u._4_4_,
                              pngFile._file.
                              super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                              .
                              super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                              .
                              super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                              .
                              super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                              .
                              super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                              .
                              super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                              ._M_u._0_4_);
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2,pngFile._file.
                             super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                             .
                             super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                             .
                             super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                             .
                             super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                             .
                             super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                             .
                             super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                             ._M_u._16_8_ - (long)pvVar2);
    }
    std::filesystem::__cxx11::path::~path(&local_1c8);
    if ((long)palmap.
              super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ._M_payload._M_value.
              super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        palmap.
        super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_payload._0_8_ != uVar24) {
      fatal("Palette map size (%zu tiles) doesn\'t match image\'s (%zu)",
            (long)palmap.
                  super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ._M_payload._M_value.
                  super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            palmap.
            super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ._M_payload._0_8_,uVar24);
    }
  }
  Options::verbosePrint(&options,'\x02',"Writing image...\n");
  pngFile._file.
  super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
  .super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>._M_u._0_4_ =
       0;
  pngFile._file.
  super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
  .super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>._M_u._4_4_ =
       0;
  pngFile._file.
  super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
  .super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>._M_index =
       '\0';
  iVar9 = File::open(&pngFile,(char *)&options.input,0x14);
  if (CONCAT44(extraout_var_00,iVar9) == 0) {
    tileRow.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&options.input;
    std::
    visit_abi_cxx11_<Visitor<File::string(std::filesystem::__cxx11::path_const&)const::_lambda(std::filebuf_const&)_1_,File::string[abi:cxx11](std::filesystem::__cxx11::path_const&)const::_lambda(std::streambuf_const*)_1_>,std::variant<std::streambuf*,std::filebuf>const&>
              ((__visit_result_t<Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:90:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:91:29)>,_const_std::variant<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>_&>
                *)rowPtrs,
               (Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:90:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:91:29)>
                *)&tileRow,&pngFile._file);
    piVar15 = __errno_location();
    pcVar16 = strerror(*piVar15);
    fatal("Failed to create \"%s\": %s",rowPtrs[0],pcVar16);
  }
  tileRow.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&options.input;
  std::
  visit_abi_cxx11_<Visitor<File::string(std::filesystem::__cxx11::path_const&)const::_lambda(std::filebuf_const&)_1_,File::string[abi:cxx11](std::filesystem::__cxx11::path_const&)const::_lambda(std::streambuf_const*)_1_>,std::variant<std::streambuf*,std::filebuf>const&>
            ((__visit_result_t<Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:90:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:91:29)>,_const_std::variant<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>_&>
              *)rowPtrs,
             (Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:90:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:91:29)>
              *)&tileRow,&pngFile._file);
  png = (png_structp)png_create_write_struct("1.6.37",rowPtrs[0],pngError,pngWarning);
  if ((uint8_t **)rowPtrs[0] != rowPtrs + 2) {
    operator_delete(rowPtrs[0],(ulong)(rowPtrs[2] + 1));
  }
  if (png == (png_structp)0x0) {
    piVar15 = __errno_location();
    pcVar16 = strerror(*piVar15);
    fatal("Couldn\'t create PNG write struct: %s",pcVar16);
  }
  pngInfo = (png_infop)png_create_info_struct(png);
  if (pngInfo == (png_infop)0x0) {
    piVar15 = __errno_location();
    pcVar16 = strerror(*piVar15);
    fatal("Couldn\'t create PNG info struct: %s",pcVar16);
  }
  png_set_write_fn(png,&pngFile,writePng,flushPng);
  png_set_IHDR(png,pngInfo,(ulong)options.reversedWidth << 3,iVar6 * 8,8,6,0,0,0);
  png_write_info(png,pngInfo);
  sbitChunk.red = '\x05';
  sbitChunk.green = '\x05';
  sbitChunk.blue = '\x05';
  sbitChunk.alpha = '\x01';
  png_set_sBIT(png,pngInfo);
  uVar4 = options.reversedWidth;
  uVar11 = (ulong)options.reversedWidth;
  rowPtrs[0] = (uint8_t *)CONCAT71(rowPtrs[0]._1_7_,0xff);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&tileRow,(ulong)options.reversedWidth << 8,(value_type_conflict *)rowPtrs,
             (allocator_type *)&local_1d8);
  rowPtrs[0] = tileRow.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
  rowPtrs[1] = tileRow.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start + (ulong)uVar4 * 0x20;
  rowPtrs[2] = tileRow.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start + (ulong)uVar4 * 0x40;
  rowPtrs[3] = tileRow.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start + (uint)uVar4 * 0x60;
  rowPtrs[4] = tileRow.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start + (ulong)uVar4 * 0x80;
  rowPtrs[5] = tileRow.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start + (uint)uVar4 * 0xa0;
  rowPtrs[6] = tileRow.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start + (uint)uVar4 * 0xc0;
  rowPtrs[7] = tileRow.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start + uVar11 * 0xe0;
  if (uVar29 <= uVar24) {
    uVar11 = 0;
    do {
      lVar13 = 0;
      lVar22 = 0;
      do {
        uVar14 = uVar11 * uVar29 + lVar22;
        if (options.columnMajor != false) {
          uVar14 = lVar22 * uVar29 + uVar11;
        }
        uVar25 = 0;
        if (attrmap.
            super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ._M_engaged == true) {
          uVar25 = (ulong)attrmap.
                          super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          ._M_payload._M_value.
                          super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar14];
        }
        uVar19 = uVar14;
        if (tilemap.
            super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ._M_engaged == true) {
          uVar8 = (uint)(uVar25 >> 3) & 1;
          uVar19 = (ulong)(int)(options.maxNbTiles._M_elems[0] * uVar8 +
                               ((uint)tilemap.
                                      super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
                                      ._M_payload.
                                      super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
                                      .
                                      super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                      ._M_payload._M_value.
                                      super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[uVar14] -
                               (uint)options.baseTileIDs._M_elems[uVar8]));
        }
        if (uVar24 <= uVar19) {
          __assert_fail("tileID < nbTileInstances",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/reverse.cpp"
                        ,0x125,"reverse");
        }
        if (palmap.
            super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ._M_engaged == true) {
          uVar8 = (uint)palmap.
                        super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        ._M_payload._M_value.
                        super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar14];
        }
        else {
          uVar8 = (uint)uVar25 & 7;
        }
        if ((ulong)((long)palettes.
                          super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)palettes.
                          super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 4) <= (ulong)uVar8) {
          __assert_fail("palID < palettes.size()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/reverse.cpp"
                        ,0x127,"reverse");
        }
        paVar26 = (array<unsigned_char,_16UL> *)
                  (tiles.
                   super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar19 * uVar18);
        if (uVar24 - options.trim < uVar19) {
          paVar26 = &reverse::trimmedTile;
        }
        uVar8 = uVar8 << 4;
        lVar27 = 0;
        do {
          cVar21 = (char)lVar27;
          if ((uVar25 & 0x40) != 0) {
            cVar21 = '\a' - (char)lVar27;
          }
          bVar28 = paVar26->_M_elems[(byte)(options.bitDepth * cVar21)];
          bVar20 = paVar26->_M_elems
                   [(ulong)(options.bitDepth != '\x01') + (ulong)(byte)(options.bitDepth * cVar21)];
          if ((uVar25 & 0x20) != 0) {
            bVar28 = flipTable._M_elems[bVar28];
            bVar20 = flipTable._M_elems[bVar20];
          }
          puVar1 = rowPtrs[lVar27];
          lVar23 = 0;
          do {
            bVar17 = bVar20 >> 6 & 2 | bVar28 >> 7;
            puVar1[lVar23 * 4 + lVar13] =
                 (&(palettes.
                    super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->_M_elems[bVar17].red)[uVar8];
            puVar1[lVar23 * 4 + lVar13 + 1] =
                 (&(palettes.
                    super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->_M_elems[bVar17].green)[uVar8];
            puVar1[lVar23 * 4 + lVar13 + 2] =
                 (&(palettes.
                    super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->_M_elems[bVar17].blue)[uVar8];
            puVar1[lVar23 * 4 + lVar13 + 3] =
                 (&(palettes.
                    super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->_M_elems[bVar17].alpha)[uVar8];
            bVar28 = bVar28 * '\x02';
            bVar20 = bVar20 * '\x02';
            lVar23 = lVar23 + 1;
          } while ((char)lVar23 != '\b');
          lVar27 = lVar27 + 1;
        } while (lVar27 != 8);
        lVar22 = lVar22 + 1;
        lVar13 = lVar13 + 0x20;
      } while (lVar22 != uVar29 + (uVar29 == 0));
      png_write_rows(png,rowPtrs,8);
      uVar11 = uVar11 + 1;
    } while (uVar11 < local_2d8);
  }
  png_write_end(png,pngInfo);
  png_destroy_write_struct(&png,&pngInfo);
  local_1d8.super_anon_class_8_1_8991fb9c.this = (anon_class_8_1_8991fb9c)&pngFile;
  std::
  visit<Visitor<File::close()::_lambda(std::filebuf&)_1_,File::close()::_lambda(std::streambuf*)_1_>,std::variant<std::streambuf*,std::filebuf>&>
            (&local_1d8,
             (variant<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
              *)local_1d8.super_anon_class_8_1_8991fb9c.this);
  if (tileRow.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(tileRow.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)tileRow.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)tileRow.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  File::~File(&pngFile);
  if ((palmap.
       super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
       ._M_payload.
       super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
       .
       super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
       ._M_engaged == true) &&
     (palmap.
      super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ._M_engaged = false,
     palmap.
     super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
     ._M_payload.
     super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
     .
     super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
     ._M_payload._M_value.
     super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
     ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
    operator_delete(palmap.
                    super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ._M_payload._M_value.
                    super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)palmap.
                          super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          ._M_payload._M_value.
                          super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    palmap.
                    super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ._M_payload._0_8_);
  }
  if ((attrmap.
       super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
       ._M_payload.
       super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
       .
       super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
       ._M_engaged == true) &&
     (attrmap.
      super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ._M_engaged = false,
     attrmap.
     super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
     ._M_payload.
     super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
     .
     super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
     ._M_payload._M_value.
     super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
     ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
    operator_delete(attrmap.
                    super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ._M_payload._M_value.
                    super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)attrmap.
                          super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          ._M_payload._M_value.
                          super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    attrmap.
                    super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ._M_payload._0_8_);
  }
  if (palettes.super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(palettes.
                    super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)palettes.
                          super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)palettes.
                          super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((tilemap.
       super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
       ._M_payload.
       super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
       .
       super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
       ._M_engaged == true) &&
     (tilemap.
      super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ._M_engaged = false,
     tilemap.
     super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
     ._M_payload.
     super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
     .
     super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
     ._M_payload._M_value.
     super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
     ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
    operator_delete(tilemap.
                    super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ._M_payload._M_value.
                    super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)tilemap.
                          super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          ._M_payload._M_value.
                          super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    tilemap.
                    super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ._M_payload._0_8_);
  }
  if (tiles.
      super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(tiles.
                    super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)tiles.
                          super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)tiles.
                          super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void reverse() {
	options.verbosePrint(Options::VERB_CFG, "Using libpng %s\n", png_get_libpng_ver(nullptr));

	// Check for weird flag combinations

	if (!options.output.has_value()) {
		fatal("Tile data must be provided when reversing an image!");
	}

	if (options.allowDedup && !options.tilemap.has_value()) {
		warning("Tile deduplication is enabled, but no tilemap is provided?");
	}

	if (options.useColorCurve) {
		warning("The color curve is not yet supported in reverse mode...");
	}

	if (options.inputSlice.left != 0 || options.inputSlice.top != 0
	    || options.inputSlice.height != 0) {
		warning("\"Sliced-off\" pixels are ignored in reverse mode");
	}
	if (options.inputSlice.width != 0 && options.inputSlice.width != options.reversedWidth * 8) {
		warning("Specified input slice width (%" PRIu16
		        ") doesn't match provided reversing width (%" PRIu8 " * 8)",
		        options.inputSlice.width, options.reversedWidth);
	}

	options.verbosePrint(Options::VERB_LOG_ACT, "Reading tiles...\n");
	auto const tiles = readInto(*options.output);
	uint8_t tileSize = 8 * options.bitDepth;
	if (tiles.size() % tileSize != 0) {
		fatal("Tile data size (%zu bytes) is not a multiple of %" PRIu8 " bytes",
		      tiles.size(), tileSize);
	}

	// By default, assume tiles are not deduplicated, and add the (allegedly) trimmed tiles
	size_t nbTileInstances = tiles.size() / tileSize + options.trim; // Image size in tiles
	options.verbosePrint(Options::VERB_INTERM, "Read %zu tiles.\n", nbTileInstances);
	std::optional<DefaultInitVec<uint8_t>> tilemap;
	if (options.tilemap.has_value()) {
		tilemap = readInto(*options.tilemap);
		nbTileInstances = tilemap->size();
		options.verbosePrint(Options::VERB_INTERM, "Read %zu tilemap entries.\n", nbTileInstances);
	}

	if (nbTileInstances == 0) {
		fatal("Cannot generate empty image");
	}
	if (nbTileInstances > options.maxNbTiles[0] + options.maxNbTiles[1]) {
		warning("Read %zu tiles, more than the limit of %zu + %zu", nbTileInstances,
		        options.maxNbTiles[0], options.maxNbTiles[1]);
	}

	size_t width = options.reversedWidth, height; // In tiles
	if (nbTileInstances % width != 0) {
		fatal("Total number of tiles read (%zu) cannot be divided by image width (%zu tiles)",
		      nbTileInstances, width);
	}
	height = nbTileInstances / width;

	options.verbosePrint(Options::VERB_INTERM, "Reversed image dimensions: %zux%zu tiles\n", width,
	                     height);

	// TODO: -U

	std::vector<std::array<Rgba, 4>> palettes{
	    {Rgba(0xFFFFFFFF), Rgba(0xAAAAAAFF), Rgba(0x555555FF), Rgba(0x000000FF)}
	};
	// If a palette file is used as input, it overrides the default colours.
	if (options.palettes.has_value()) {
		File file;
		if (!file.open(*options.palettes, std::ios::in | std::ios::binary)) {
			fatal("Failed to open \"%s\": %s", file.string(*options.palettes).c_str(),
			      strerror(errno));
		}

		palettes.clear();
		std::array<uint8_t, sizeof(uint16_t) * 4> buf; // 4 colors
		size_t nbRead;
		do {
			nbRead = file->sgetn(reinterpret_cast<char *>(buf.data()), buf.size());
			if (nbRead == buf.size()) {
				// Expand the colors
				auto &palette = palettes.emplace_back();
				std::generate(palette.begin(), palette.begin() + options.nbColorsPerPal,
				              [&buf, i = 0]() mutable {
					              i += 2;
					              return Rgba::fromCGBColor(buf[i - 2] + (buf[i - 1] << 8));
				              });
			} else if (nbRead != 0) {
				fatal("Palette data size (%zu) is not a multiple of %zu bytes!\n",
				      palettes.size() * buf.size() + nbRead, buf.size());
			}
		} while (nbRead != 0);

		if (palettes.size() > options.nbPalettes) {
			warning("Read %zu palettes, more than the specified limit of %zu", palettes.size(),
			        options.nbPalettes);
		}

		if (options.palSpecType == Options::EXPLICIT && palettes != options.palSpec) {
			warning("Colors in the palette file do not match those specified with `-c`!");
		}
	} else if (options.palSpecType == Options::EMBEDDED) {
		warning("An embedded palette was requested, but no palette file was specified; ignoring request.");
	} else if (options.palSpecType == Options::EXPLICIT) {
		palettes = std::move(options.palSpec); // We won't be using it again.
	}

	std::optional<DefaultInitVec<uint8_t>> attrmap;
	if (options.attrmap.has_value()) {
		attrmap = readInto(*options.attrmap);
		if (attrmap->size() != nbTileInstances) {
			fatal("Attribute map size (%zu tiles) doesn't match image's (%zu)", attrmap->size(),
			      nbTileInstances);
		}

		// Scan through the attributes for inconsistencies
		// We do this now for two reasons:
		// 1. Checking those during the main loop is harmful to optimization, and
		// 2. It clutters the code more, and it's not in great shape to begin with
		bool bad = false;
		for (auto attr : *attrmap) {
			if ((attr & 0b111) > palettes.size()) {
				error("Referencing palette %u, but there are only %zu!");
				bad = true;
			}
			if (attr & 0x08 && !tilemap) {
				warning("Tile in bank 1 but no tilemap specified; ignoring the bank bit");
			}
		}
		if (bad) {
			giveUp();
		}
	}

	if (tilemap) {
		if (attrmap) {
			for (auto [id, attr] : zip(*tilemap, *attrmap)) {
				bool bank = attr & 1 << 3;
				if (id >= options.maxNbTiles[bank]) {
					warning("Tile #%" PRIu8
					        " was referenced, but the limit for bank %u is %" PRIu16,
					        id, bank, options.maxNbTiles[bank]);
				}
			}
		} else {
			for (auto id : *tilemap) {
				if (id >= options.maxNbTiles[0]) {
					warning("Tile #%" PRIu8 " was referenced, but the limit is %" PRIu16, id,
					        options.maxNbTiles[0]);
				}
			}
		}
	}

	std::optional<DefaultInitVec<uint8_t>> palmap;
	if (options.palmap.has_value()) {
		palmap = readInto(*options.palmap);
		if (palmap->size() != nbTileInstances) {
			fatal("Palette map size (%zu tiles) doesn't match image's (%zu)", palmap->size(),
			      nbTileInstances);
		}
	}

	options.verbosePrint(Options::VERB_LOG_ACT, "Writing image...\n");
	File pngFile;
	if (!pngFile.open(*options.input, std::ios::out | std::ios::binary)) {
		fatal("Failed to create \"%s\": %s", pngFile.string(*options.input).c_str(),
		      strerror(errno));
	}
	png_structp png = png_create_write_struct(
	    PNG_LIBPNG_VER_STRING,
	    const_cast<png_voidp>(static_cast<void const *>(pngFile.string(*options.input).c_str())),
	    pngError, pngWarning);
	if (!png) {
		fatal("Couldn't create PNG write struct: %s", strerror(errno));
	}
	png_infop pngInfo = png_create_info_struct(png);
	if (!pngInfo) {
		fatal("Couldn't create PNG info struct: %s", strerror(errno));
	}
	png_set_write_fn(png, &pngFile, writePng, flushPng);

	png_set_IHDR(png, pngInfo, options.reversedWidth * 8, height * 8, 8, PNG_COLOR_TYPE_RGB_ALPHA,
	             PNG_INTERLACE_NONE, PNG_COMPRESSION_TYPE_DEFAULT, PNG_FILTER_TYPE_DEFAULT);
	png_write_info(png, pngInfo);

	png_color_8 sbitChunk;
	sbitChunk.red = 5;
	sbitChunk.green = 5;
	sbitChunk.blue = 5;
	sbitChunk.alpha = 1;
	png_set_sBIT(png, pngInfo, &sbitChunk);

	constexpr uint8_t SIZEOF_PIXEL = 4; // Each pixel is 4 bytes (RGBA @ 8 bits/component)
	size_t const SIZEOF_ROW = options.reversedWidth * 8 * SIZEOF_PIXEL;
	std::vector<uint8_t> tileRow(8 * SIZEOF_ROW, 0xFF); // Data for 8 rows of pixels
	uint8_t * const rowPtrs[8] = {
	    &tileRow.data()[0 * SIZEOF_ROW], &tileRow.data()[1 * SIZEOF_ROW],
	    &tileRow.data()[2 * SIZEOF_ROW], &tileRow.data()[3 * SIZEOF_ROW],
	    &tileRow.data()[4 * SIZEOF_ROW], &tileRow.data()[5 * SIZEOF_ROW],
	    &tileRow.data()[6 * SIZEOF_ROW], &tileRow.data()[7 * SIZEOF_ROW],
	};

	for (size_t ty = 0; ty < height; ++ty) {
		for (size_t tx = 0; tx < width; ++tx) {
			size_t index = options.columnMajor ? ty + tx * width : ty * width + tx;
			// By default, a tile is unflipped, in bank 0, and uses palette #0
			uint8_t attribute = attrmap.has_value() ? (*attrmap)[index] : 0x00;
			bool bank = attribute & 0x08;
			// Get the tile ID at this location
			size_t tileID = index;
			if (tilemap.has_value()) {
				tileID =
				    (*tilemap)[index] - options.baseTileIDs[bank] + bank * options.maxNbTiles[0];
			}
			assert(tileID < nbTileInstances); // Should have been checked earlier
			size_t palID = palmap ? (*palmap)[index] : attribute & 0b111;
			assert(palID < palettes.size()); // Should be ensured on data read

			// We do not have data for tiles trimmed with `-x`, so assume they are "blank"
			static std::array<uint8_t, 16> const trimmedTile{
			    0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
			    0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
			};
			uint8_t const *tileData = tileID > nbTileInstances - options.trim
			                              ? trimmedTile.data()
			                              : &tiles[tileID * tileSize];
			auto const &palette = palettes[palID];
			for (uint8_t y = 0; y < 8; ++y) {
				// If vertically mirrored, fetch the bytes from the other end
				uint8_t realY = (attribute & 0x40 ? 7 - y : y) * options.bitDepth;
				uint8_t bitplane0 = tileData[realY];
				uint8_t bitplane1 = tileData[realY + 1 % options.bitDepth];
				if (attribute & 0x20) { // Handle horizontal flip
					bitplane0 = flipTable[bitplane0];
					bitplane1 = flipTable[bitplane1];
				}
				uint8_t *ptr = &rowPtrs[y][tx * 8 * SIZEOF_PIXEL];
				for (uint8_t x = 0; x < 8; ++x) {
					uint8_t bit0 = bitplane0 & 0x80, bit1 = bitplane1 & 0x80;
					Rgba const &pixel = palette[bit0 >> 7 | bit1 >> 6];
					*ptr++ = pixel.red;
					*ptr++ = pixel.green;
					*ptr++ = pixel.blue;
					*ptr++ = pixel.alpha;

					// Shift the pixel out
					bitplane0 <<= 1;
					bitplane1 <<= 1;
				}
			}
		}
		// We never modify the pointers, and neither should libpng, despite the overly lax function
		// signature.
		// (AIUI, casting away const-ness is okay as long as you don't actually modify the
		// pointed-to data)
		png_write_rows(png, const_cast<png_bytepp>(rowPtrs), 8);
	}

	// Finalize the write
	png_write_end(png, pngInfo);

	png_destroy_write_struct(&png, &pngInfo);
	pngFile.close();
}